

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O1

int boost::report_errors(void)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  
  if (detail::report_errors_remind()::r == '\0') {
    report_errors();
  }
  detail::report_errors_remind()::r = 1;
  if (detail::report_errors_remind()::r == '\0') {
    report_errors();
  }
  iVar2 = detail::test_errors()::x;
  if (detail::test_errors()::x == 0) {
    poVar1 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No errors detected.",0x13);
    iVar2 = 0;
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,detail::test_errors()::x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," error",6);
    pcVar3 = "";
    if (iVar2 != 1) {
      pcVar3 = "s";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,(ulong)(iVar2 != 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," detected.",10);
    iVar2 = 1;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return iVar2;
}

Assistant:

inline report_errors_reminder& report_errors_remind()
{
    static report_errors_reminder r;
    return r;
}